

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateString(char *string)

{
  cJSON *pcVar1;
  char *pcVar2;
  cJSON *item;
  char *string_local;
  
  pcVar1 = cJSON_New_Item();
  if (pcVar1 != (cJSON *)0x0) {
    pcVar1->type = 4;
    pcVar2 = cJSON_strdup(string);
    pcVar1->valuestring = pcVar2;
  }
  return pcVar1;
}

Assistant:

cJSON *
cJSON_CreateString(const char *string)
{
    cJSON *item = cJSON_New_Item();
    if (item) {
        item->type = cJSON_String;
        item->valuestring = cJSON_strdup(string);
    }
    return item;
}